

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O3

bool __thiscall
ON_HistoryRecord::GetVectorValue(ON_HistoryRecord *this,int value_id,ON_3dVector *vector)

{
  double *pdVar1;
  double dVar2;
  ON_Value *pOVar3;
  bool bVar4;
  
  bVar4 = false;
  pOVar3 = FindValueHelper(this,value_id,6,false);
  if (pOVar3 != (ON_Value *)0x0) {
    if (*(int *)&pOVar3[2]._vptr_ON_Value == 1) {
      pdVar1 = *(double **)&pOVar3[1].m_value_id;
      vector->z = pdVar1[2];
      dVar2 = pdVar1[1];
      vector->x = *pdVar1;
      vector->y = dVar2;
      bVar4 = true;
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool ON_HistoryRecord::GetVectorValue( int value_id, ON_3dVector& vector ) const
{
  bool rc = false;
  const ON_VectorValue* v = static_cast<ON_VectorValue*>(FindValueHelper(value_id,ON_Value::vector_value,0));
  if ( v && 1 == v->m_value.Count())
  {
    vector = v->m_value[0];
    rc = true;
  }
  return rc;
}